

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O3

bool __thiscall absl::AbslParseFlag(absl *this,string_view text,LogSeverity *dst,string *err)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  byte *pbVar3;
  int *piVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view text_00;
  string_view piece2;
  string_view piece2_00;
  string_view piece2_01;
  string_view piece2_02;
  string_view piece2_03;
  string_view piece2_04;
  string_view sVar9;
  type_conflict2 numeric_value;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  piVar4 = (int *)text._M_str;
  sVar9 = StripLeadingAsciiWhitespace(this,text);
  pbVar8 = (byte *)sVar9._M_str;
  uVar2 = sVar9._M_len;
  pbVar3 = pbVar8 + uVar2;
  pbVar6 = pbVar3;
  if (0 < (long)uVar2 >> 2) {
    pbVar6 = pbVar8 + ((uint)sVar9._M_len & 3);
    lVar5 = ((long)uVar2 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[pbVar3[-1]] & 8) == 0) goto LAB_0012482e;
      if (((&ascii_internal::kPropertyBits)[pbVar3[-2]] & 8) == 0) {
        pbVar3 = pbVar3 + -1;
        goto LAB_0012482e;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar3[-3]] & 8) == 0) {
        pbVar3 = pbVar3 + -2;
        goto LAB_0012482e;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar3[-4]] & 8) == 0) {
        pbVar3 = pbVar3 + -3;
        goto LAB_0012482e;
      }
      pbVar3 = pbVar3 + -4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar6 - (long)pbVar8;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar3 = pbVar8;
      if ((lVar5 != 3) || (pbVar3 = pbVar6, ((&ascii_internal::kPropertyBits)[pbVar6[-1]] & 8) == 0)
         ) goto LAB_0012482e;
      pbVar6 = pbVar6 + -1;
    }
    pbVar3 = pbVar6;
    if (((&ascii_internal::kPropertyBits)[pbVar6[-1]] & 8) == 0) goto LAB_0012482e;
    pbVar6 = pbVar6 + -1;
  }
  pbVar3 = pbVar6;
  if (((&ascii_internal::kPropertyBits)[pbVar6[-1]] & 8) != 0) {
    pbVar3 = pbVar8;
  }
LAB_0012482e:
  uVar7 = (long)pbVar3 - (long)pbVar8;
  if (uVar2 < (ulong)((long)pbVar3 - (long)pbVar8)) {
    uVar7 = uVar2;
  }
  if (uVar7 == 0) {
    std::__cxx11::string::_M_replace((ulong)dst,0,*(char **)(dst + 2),0x1684d6);
    return false;
  }
  sVar9._M_str = (char *)pbVar8;
  sVar9._M_len = uVar7;
  piece2._M_str = "dfatal";
  piece2._M_len = 6;
  bVar1 = EqualsIgnoreCase(sVar9,piece2);
  if ((!bVar1) &&
     (piece1._M_str = (char *)pbVar8, piece1._M_len = uVar7, piece2_00._M_str = "klogdebugfatal",
     piece2_00._M_len = 0xe, bVar1 = EqualsIgnoreCase(piece1,piece2_00), !bVar1)) {
    if ((*pbVar8 | 0x20) == 0x6b) {
      pbVar8 = pbVar8 + 1;
      uVar7 = uVar7 - 1;
    }
    piece1_00._M_str = (char *)pbVar8;
    piece1_00._M_len = uVar7;
    piece2_01._M_str = "info";
    piece2_01._M_len = 4;
    bVar1 = EqualsIgnoreCase(piece1_00,piece2_01);
    if (bVar1) {
      *piVar4 = 0;
      return true;
    }
    piece1_01._M_str = (char *)pbVar8;
    piece1_01._M_len = uVar7;
    piece2_02._M_str = "warning";
    piece2_02._M_len = 7;
    bVar1 = EqualsIgnoreCase(piece1_01,piece2_02);
    if (bVar1) {
      *piVar4 = 1;
      return true;
    }
    piece1_02._M_str = (char *)pbVar8;
    piece1_02._M_len = uVar7;
    piece2_03._M_str = "error";
    piece2_03._M_len = 5;
    bVar1 = EqualsIgnoreCase(piece1_02,piece2_03);
    if (bVar1) {
      *piVar4 = 2;
      return true;
    }
    piece1_03._M_str = (char *)pbVar8;
    piece1_03._M_len = uVar7;
    piece2_04._M_str = "fatal";
    piece2_04._M_len = 5;
    bVar1 = EqualsIgnoreCase(piece1_03,piece2_04);
    if (!bVar1) {
      text_00._M_str = (char *)pbVar8;
      text_00._M_len = uVar7;
      bVar1 = flags_internal::ParseFlagImpl<int>(text_00,&local_24);
      if (!bVar1) {
        std::__cxx11::string::operator=
                  ((string *)dst,
                   "only integers, absl::LogSeverity enumerators, and DFATAL are accepted");
        return bVar1;
      }
      *piVar4 = local_24;
      return bVar1;
    }
  }
  *piVar4 = 3;
  return true;
}

Assistant:

bool AbslParseFlag(absl::string_view text, absl::LogSeverity* dst,
                   std::string* err) {
  text = absl::StripAsciiWhitespace(text);
  if (text.empty()) {
    *err = "no value provided";
    return false;
  }
  if (absl::EqualsIgnoreCase(text, "dfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "klogdebugfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (text.front() == 'k' || text.front() == 'K') text.remove_prefix(1);
  if (absl::EqualsIgnoreCase(text, "info")) {
    *dst = absl::LogSeverity::kInfo;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "warning")) {
    *dst = absl::LogSeverity::kWarning;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "error")) {
    *dst = absl::LogSeverity::kError;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "fatal")) {
    *dst = absl::LogSeverity::kFatal;
    return true;
  }
  std::underlying_type<absl::LogSeverity>::type numeric_value;
  if (absl::ParseFlag(text, &numeric_value, err)) {
    *dst = static_cast<absl::LogSeverity>(numeric_value);
    return true;
  }
  *err =
      "only integers, absl::LogSeverity enumerators, and DFATAL are accepted";
  return false;
}